

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<std::vector<char,_std::allocator<char>_>_> * __thiscall
VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>::value
          (typed_option<std::vector<char,_std::allocator<char>_>_> *this,
          vector<char,_std::allocator<char>_> *value)

{
  typed_option<std::vector<char,_std::allocator<char>_>_> *in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_00000008;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffe0;
  
  std::make_shared<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>&>
            (in_stack_00000008);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::operator=
            (in_stack_ffffffffffffffe0,
             (shared_ptr<std::vector<char,_std::allocator<char>_>_> *)in_RDI);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0x3658a0);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }